

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

string * __thiscall
sqlite_orm::internal::
table_t<relive::Track,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,std::tuple<long_relive::Stream::*>>>
::find_column_name<long,relive::Track,void>(table_t<_45d12b31_> *this,offset_in_Track_to_long m)

{
  table_t<_45d12b31_> *in_RDI;
  string *res;
  table_t<_45d12b31_> *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  for_each_column_with_field_type<long,sqlite_orm::internal::table_t<relive::Track,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,std::tuple<long_relive::Stream::*>>>::find_column_name<long,relive::Track,void>(long_relive::Track::*)const::_lambda(auto:1&)_1_>
            (this_00,(anon_class_16_2_de34c1f6 *)in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string find_column_name(F O::*m) const {
        std::string res;
        this->template for_each_column_with_field_type<F>([&res, m](auto &c) {
          if(c.member_pointer == m) {
              res = c.name;
          }
        });
        return res;
    }